

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_fwd_txfm.c
# Opt level: O0

void highbd_wht_fwd_txfm(TX_SIZE tx_size,int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  tran_low_t *in_RCX;
  ptrdiff_t in_RDX;
  int16_t *in_RSI;
  undefined1 in_DIL;
  tran_low_t *in_stack_00000028;
  ptrdiff_t in_stack_00000030;
  int16_t *in_stack_00000038;
  
  switch(in_DIL) {
  case 0:
    aom_hadamard_4x4_sse2(in_stack_00000038,in_stack_00000030,in_stack_00000028);
    break;
  case 1:
    (*aom_highbd_hadamard_8x8)(in_RSI,in_RDX,in_RCX);
    break;
  case 2:
    (*aom_highbd_hadamard_16x16)(in_RSI,in_RDX,in_RCX);
    break;
  case 3:
    (*aom_highbd_hadamard_32x32)(in_RSI,in_RDX,in_RCX);
  }
  return;
}

Assistant:

static inline void highbd_wht_fwd_txfm(TX_SIZE tx_size, const int16_t *src_diff,
                                       ptrdiff_t src_stride,
                                       tran_low_t *coeff) {
  switch (tx_size) {
    // As the output transform co-efficients of 4x4 Hadamard transform can be
    // represented using 15 bits (for 12-bit clip) use lowbd variant of
    // hadamard_4x4.
    case TX_4X4: aom_hadamard_4x4(src_diff, src_stride, coeff); break;
    case TX_8X8: aom_highbd_hadamard_8x8(src_diff, src_stride, coeff); break;
    case TX_16X16:
      aom_highbd_hadamard_16x16(src_diff, src_stride, coeff);
      break;
    case TX_32X32:
      aom_highbd_hadamard_32x32(src_diff, src_stride, coeff);
      break;
    default: assert(0);
  }
}